

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_interpolation_error
          (REF_DBL *metric,REF_DBL *hess,REF_GRID ref_grid,REF_DBL *interpolation_error)

{
  double dVar1;
  double dVar2;
  REF_NODE ref_node;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  REF_DBL det;
  REF_DBL error [6];
  REF_DBL m1neghalf [6];
  REF_DBL m1half [6];
  double local_d0;
  double local_c8 [3];
  double local_b0;
  double local_a0;
  REF_DBL local_98 [6];
  REF_DBL local_68 [7];
  
  ref_node = ref_grid->node;
  if (0 < ref_node->max) {
    dVar1 = *(double *)(&DAT_0021b710 + (ulong)(ref_grid->twod == 0) * 8);
    lVar6 = 0;
    do {
      if ((-1 < ref_node->global[lVar6]) && (ref_node->ref_mpi->id == ref_node->part[lVar6])) {
        uVar3 = ref_matrix_sqrt_m(metric,local_68,local_98);
        if (uVar3 != 0) {
          pcVar5 = "m^-1/2";
          uVar4 = 0x3ed;
          goto LAB_00179264;
        }
        uVar3 = ref_matrix_mult_m0m1m0(local_98,hess,local_c8);
        if (uVar3 != 0) {
          pcVar5 = "error=m1half*hess*m1half";
          uVar4 = 0x3ef;
          goto LAB_00179264;
        }
        uVar3 = ref_matrix_det_m(metric,&local_d0);
        if (uVar3 != 0) {
          pcVar5 = "det";
          uVar4 = 0x3f0;
          goto LAB_00179264;
        }
        dVar7 = local_c8[0] + local_b0;
        if (ref_grid->twod == 0) {
          dVar7 = dVar7 + local_a0;
        }
        interpolation_error[lVar6] = dVar7 * dVar1;
        dVar7 = 0.0;
        if (0.0 <= local_d0) {
          if (local_d0 < 0.0) {
            dVar8 = sqrt(local_d0);
          }
          else {
            dVar8 = SQRT(local_d0);
          }
          dVar7 = 0.0;
          auVar9._0_8_ = dVar8 * 1e+20;
          dVar2 = interpolation_error[lVar6];
          auVar9._8_8_ = dVar2;
          auVar10._8_8_ = -dVar2;
          auVar10._0_8_ = -auVar9._0_8_;
          auVar10 = maxpd(auVar9,auVar10);
          if (auVar10._8_8_ < auVar10._0_8_) {
            dVar7 = dVar2 / dVar8;
          }
        }
        interpolation_error[lVar6] = dVar7;
      }
      lVar6 = lVar6 + 1;
      hess = hess + 6;
      metric = metric + 6;
    } while (lVar6 < ref_node->max);
  }
  uVar3 = ref_node_ghost_dbl(ref_node,interpolation_error,1);
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    pcVar5 = "update ghosts";
    uVar4 = 0x402;
LAB_00179264:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar4,
           "ref_metric_interpolation_error",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error(
    REF_DBL *metric, REF_DBL *hess, REF_GRID ref_grid,
    REF_DBL *interpolation_error) {
  /* Corollary 3.4 CONTINUOUS MESH FRAMEWORK PART I DOI:10.1137/090754078 */
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL error[6], m1half[6], m1neghalf[6], det, sqrt_det;
  REF_DBL constant = 1.0 / 10.0;
  if (ref_grid_twod(ref_grid)) {
    constant = 1.0 / 8.0;
  }
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_sqrt_m(&(metric[6 * node]), m1half, m1neghalf), "m^-1/2");
      RSS(ref_matrix_mult_m0m1m0(m1neghalf, &(hess[6 * node]), error),
          "error=m1half*hess*m1half");
      RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det");
      if (ref_grid_twod(ref_grid)) {
        interpolation_error[node] = constant * (error[0] + error[3]);
      } else {
        interpolation_error[node] = constant * (error[0] + error[3] + error[5]);
      }
      if (det >= 0.0) {
        sqrt_det = sqrt(det);
        if (ref_math_divisible(interpolation_error[node], sqrt_det)) {
          interpolation_error[node] /= sqrt_det;
        } else {
          interpolation_error[node] = 0.0;
        }
      } else {
        interpolation_error[node] = 0.0;
      }
    }
  }
  RSS(ref_node_ghost_dbl(ref_node, interpolation_error, 1), "update ghosts");

  return REF_SUCCESS;
}